

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O1

NodeRef<typename_TapSatisfier::Key> __thiscall
miniscript::FromScript<TapSatisfier>(miniscript *this,CScript *script,TapSatisfier *ctx)

{
  MiniscriptContext MVar1;
  uint uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  uint uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  long in_FS_OFFSET;
  NodeRef<XOnlyPubKey> NVar6;
  NodeRef<typename_TapSatisfier::Key> NVar7;
  NodeRef<XOnlyPubKey> ret;
  iterator it;
  optional<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  decomposed;
  long local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  __normal_iterator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  local_48;
  _Storage<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_false>
  local_40;
  char local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (script->super_CScriptBase)._size;
  uVar2 = uVar4 - 0x1d;
  if (uVar4 < 0x1d) {
    uVar2 = uVar4;
  }
  MVar1 = (ctx->super_Satisfier<XOnlyPubKey>).m_script_ctx;
  _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)MVar1;
  uVar4 = 0xe10;
  if (MVar1 != P2WSH) {
    if (MVar1 != TAPSCRIPT) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                    ,0xf6,"bool miniscript::IsTapscript(MiniscriptContext)");
    }
    uVar4 = 0x5070a;
  }
  if (uVar4 < uVar2) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_003cdae9:
      __stack_chk_fail();
    }
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    internal::DecomposeScript
              ((optional<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                *)&local_40._M_value,script);
    if (local_28 == '\0') {
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
      _Var5._M_pi = extraout_RDX;
    }
    else {
      local_48._M_current =
           local_40._M_value.
           super__Vector_base<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      NVar6 = internal::
              DecodeScript<XOnlyPubKey,TapSatisfier,__gnu_cxx::__normal_iterator<std::pair<opcodetype,std::vector<unsigned_char,std::allocator<unsigned_char>>>*,std::vector<std::pair<opcodetype,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<opcodetype,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>>
                        ((internal *)&local_58,&local_48,
                         (__normal_iterator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                          )local_40._M_value.
                           super__Vector_base<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,ctx);
      p_Var3 = local_50;
      _Var5 = NVar6.
              super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if ((local_58 == 0) ||
         (local_48._M_current !=
          local_40._M_value.
          super__Vector_base<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        *(undefined8 *)this = 0;
        *(undefined8 *)(this + 8) = 0;
      }
      else {
        *(long *)this = local_58;
        *(undefined8 *)(this + 8) = 0;
        local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var3;
        local_58 = 0;
      }
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
        _Var5._M_pi = extraout_RDX_00;
      }
    }
    if (local_28 == '\x01') {
      local_28 = '\0';
      std::
      vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~vector(&local_40._M_value);
      _Var5._M_pi = extraout_RDX_01;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_003cdae9;
  }
  NVar7.super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var5._M_pi;
  NVar7.super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (NodeRef<typename_TapSatisfier::Key>)
         NVar7.super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline NodeRef<typename Ctx::Key> FromScript(const CScript& script, const Ctx& ctx) {
    using namespace internal;
    // A too large Script is necessarily invalid, don't bother parsing it.
    if (script.size() > MaxScriptSize(ctx.MsContext())) return {};
    auto decomposed = DecomposeScript(script);
    if (!decomposed) return {};
    auto it = decomposed->begin();
    auto ret = DecodeScript<typename Ctx::Key>(it, decomposed->end(), ctx);
    if (!ret) return {};
    if (it != decomposed->end()) return {};
    return ret;
}